

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O1

ulong mcmcsiz(mcmcxdef *cctx)

{
  ulong uVar1;
  mcmhdef **ppmVar2;
  
  ppmVar2 = &cctx->mcmcxgl->mcmcxhpch;
  uVar1 = 0xffffffffffff8000;
  do {
    ppmVar2 = &(*ppmVar2)->mcmhnxt;
    uVar1 = uVar1 + 0x8000;
  } while (ppmVar2 != (mcmhdef **)0x0);
  return uVar1;
}

Assistant:

ulong mcmcsiz(mcmcxdef *cctx)
{
    mcmcx1def *ctx = cctx->mcmcxgl;
    mcmhdef   *p;
    ulong      tot;
    
    MCMCLICTX(cctx);
    MCMGLBCTX(ctx);
    
    /* count number of heaps, adding in chunk size for each */
    for (tot = 0, p = ctx->mcmcxhpch ; p ; p = p->mcmhnxt)
        tot += MCMCHUNK;
    
    return(tot);
}